

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wirehair.cpp
# Opt level: O1

WirehairResult wirehair_init_(int expected_version)

{
  WirehairResult WVar1;
  int iVar2;
  
  WVar1 = Wirehair_InvalidInput;
  if (expected_version == 2) {
    iVar2 = gf256_init_(2);
    WVar1 = Wirehair_UnsupportedPlatform;
    if (iVar2 == 0) {
      m_init = 1;
      return Wirehair_Success;
    }
  }
  return WVar1;
}

Assistant:

WIREHAIR_EXPORT WirehairResult wirehair_init_(int expected_version)
{
    // If version does not match:
    if (expected_version != WIREHAIR_VERSION) {
        return Wirehair_InvalidInput;
    }

    const int gfInitResult = gf256_init();

    // If gf256 init failed:
    if (gfInitResult != 0) {
        return Wirehair_UnsupportedPlatform;
    }

    m_init = true;
    return Wirehair_Success;
}